

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLRParser.cpp
# Opt level: O3

void __thiscall GLRParser::GLRParser(GLRParser *this,CFG *cfg,bool verbose)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  pointer pbVar3;
  pointer pcVar4;
  size_t sVar5;
  _Base_ptr p_Var6;
  uint __val;
  undefined8 uVar7;
  undefined8 uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar12;
  vector<Production_*,_std::allocator<Production_*>_> *__x;
  string *psVar13;
  GLRParser *pGVar14;
  GLRState *pGVar15;
  Production *pPVar16;
  pointer ppPVar17;
  _Rb_tree_node_base *p_Var18;
  _Base_ptr p_Var19;
  _Base_ptr p_Var20;
  undefined8 *puVar21;
  GLRState *pGVar22;
  _Rb_tree_node_base *p_Var23;
  uint __len;
  _Self __tmp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *c;
  pointer pbVar24;
  long lVar25;
  size_t sVar26;
  ulong uVar27;
  bool bVar28;
  bool bVar29;
  pair<std::_Rb_tree_iterator<Production_*>,_bool> pVar30;
  undefined1 auVar31 [16];
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<Production_*> __l_01;
  initializer_list<Production_*> __l_02;
  string var;
  string startS;
  set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_> sMovedRightOfX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  prodToMarked;
  set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_> startClosure;
  string s;
  set<GLRState_*,_std::less<GLRState_*>,_std::allocator<GLRState_*>_> *__range2;
  GLRState *closureY;
  Production *start;
  vector<Production_*,_std::allocator<Production_*>_> productionsP;
  string oldStartState;
  GLRState *newState;
  ulong local_2e0;
  undefined1 local_2d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  undefined1 local_290 [16];
  undefined1 local_280 [40];
  undefined1 local_258 [16];
  undefined1 local_248 [24];
  _Base_ptr local_230;
  undefined1 local_228 [16];
  undefined1 local_218 [32];
  undefined1 local_1f8 [8];
  undefined1 auStack_1f0 [24];
  GLRState *local_1d8;
  size_t local_1d0;
  undefined1 local_1c0 [32];
  _Rb_tree<GLRState*,GLRState*,std::_Identity<GLRState*>,std::less<GLRState*>,std::allocator<GLRState*>>
  *local_1a0;
  GLRState *local_198 [2];
  undefined1 local_188 [16];
  undefined1 local_178 [8];
  vector<Production_*,_std::allocator<Production_*>_> local_170;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_158;
  _Base_ptr local_150;
  _Base_ptr local_148;
  _Base_ptr local_140 [2];
  _Base_ptr local_130;
  string local_128;
  GLRState *local_108;
  string local_100;
  string local_e0;
  _Rb_tree<Production_*,_Production_*,_std::_Identity<Production_*>,_std::less<Production_*>,_std::allocator<Production_*>_>
  local_c0;
  _Rb_tree<Production_*,_Production_*,_std::_Identity<Production_*>,_std::less<Production_*>,_std::allocator<Production_*>_>
  local_90;
  _Rb_tree<Production_*,_Production_*,_std::_Identity<Production_*>,_std::less<Production_*>,_std::allocator<Production_*>_>
  local_60;
  
  this->verbose = verbose;
  local_280._32_8_ = &this->nonTerminalsV;
  p_Var1 = &(this->nonTerminalsV)._M_t._M_impl.super__Rb_tree_header;
  (this->nonTerminalsV)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->nonTerminalsV)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->nonTerminalsV)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->nonTerminalsV)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  local_158 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
               *)&this->terminalsT;
  p_Var1 = &(this->terminalsT)._M_t._M_impl.super__Rb_tree_header;
  (this->terminalsT)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->terminalsT)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->nonTerminalsV)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->acceptState = (GLRState *)0x0;
  (this->terminalsT)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->terminalsT)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->terminalsT)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1a0 = (_Rb_tree<GLRState*,GLRState*,std::_Identity<GLRState*>,std::less<GLRState*>,std::allocator<GLRState*>>
               *)&this->states;
  p_Var1 = &(this->states)._M_t._M_impl.super__Rb_tree_header;
  (this->states)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->states)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->states)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->states)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->states)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  CFG::splitUpLongerTerminals(cfg);
  pvVar12 = CFG::getNonTerminalsV_abi_cxx11_(cfg);
  pbVar3 = (pvVar12->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar24 = (pvVar12->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start; pbVar24 != pbVar3;
      pbVar24 = pbVar24 + 1) {
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)local_280._32_8_,pbVar24);
  }
  pvVar12 = CFG::getTerminalsT_abi_cxx11_(cfg);
  pbVar3 = (pvVar12->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar24 = (pvVar12->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start; pbVar24 != pbVar3;
      pbVar24 = pbVar24 + 1) {
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>(local_158,pbVar24);
  }
  __x = CFG::getProductionsP(cfg);
  std::vector<Production_*,_std::allocator<Production_*>_>::vector(&local_170,__x);
  psVar13 = CFG::getStartS_abi_cxx11_(cfg);
  local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  pcVar4 = (psVar13->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2b0,pcVar4,pcVar4 + psVar13->_M_string_length);
  local_150 = (_Base_ptr)local_140;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_150,local_2b0._M_dataplus._M_p,
             local_2b0._M_dataplus._M_p + local_2b0._M_string_length);
  startStateName_abi_cxx11_();
  std::__cxx11::string::operator=((string *)&local_2b0,(string *)local_1f8);
  pcVar4 = auStack_1f0 + 8;
  if (local_1f8 != (undefined1  [8])pcVar4) {
    operator_delete((void *)local_1f8,auStack_1f0._8_8_ + 1);
  }
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string_const&>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)local_280._32_8_,&local_2b0);
  pGVar14 = (GLRParser *)operator_new(0x38);
  local_1f8 = (undefined1  [8])pcVar4;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1f8,local_150,(long)&local_150->_M_color + (long)&local_148->_M_color);
  __l._M_len = 1;
  __l._M_array = (iterator)local_1f8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_228,__l,(allocator_type *)local_258);
  Production::Production
            ((Production *)pGVar14,&local_2b0,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_228);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_228);
  if (local_1f8 != (undefined1  [8])pcVar4) {
    operator_delete((void *)local_1f8,auStack_1f0._8_8_ + 1);
  }
  local_178 = (undefined1  [8])pGVar14;
  if (local_170.super__Vector_base<Production_*,_std::allocator<Production_*>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_170.super__Vector_base<Production_*,_std::allocator<Production_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Production*,std::allocator<Production*>>::_M_realloc_insert<Production*const&>
              ((vector<Production*,std::allocator<Production*>> *)&local_170,
               (iterator)
               local_170.super__Vector_base<Production_*,_std::allocator<Production_*>_>._M_impl.
               super__Vector_impl_data._M_finish,(Production **)local_178);
  }
  else {
    *local_170.super__Vector_base<Production_*,_std::allocator<Production_*>_>._M_impl.
     super__Vector_impl_data._M_finish = (Production *)pGVar14;
    local_170.super__Vector_base<Production_*,_std::allocator<Production_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_170.super__Vector_base<Production_*,_std::allocator<Production_*>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  pGVar15 = (GLRState *)operator_new(0xb8);
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"accept","");
  pPVar16 = (Production *)operator_new(0x38);
  local_1f8 = (undefined1  [8])pcVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"accept","");
  local_228._0_8_ = local_218;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_228,local_2b0._M_dataplus._M_p,
             local_2b0._M_dataplus._M_p + local_2b0._M_string_length);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)local_228;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_258,__l_00,(allocator_type *)local_1c0);
  Production::Production
            (pPVar16,(string *)local_1f8,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_258);
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)local_290;
  local_290._0_8_ = pPVar16;
  std::set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>::set
            ((set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_> *)&local_60,
             __l_01,(less<Production_*> *)local_2d0,(allocator_type *)local_198);
  GLRState::GLRState(pGVar15,&local_100,
                     (set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_> *)
                     &local_60);
  this->acceptState = pGVar15;
  std::
  _Rb_tree<Production_*,_Production_*,_std::_Identity<Production_*>,_std::less<Production_*>,_std::allocator<Production_*>_>
  ::~_Rb_tree(&local_60);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_258);
  if ((GLRParser *)local_228._0_8_ != (GLRParser *)local_218) {
    operator_delete((void *)local_228._0_8_,(ulong)(local_218._0_8_ + 1));
  }
  if (local_1f8 != (undefined1  [8])pcVar4) {
    operator_delete((void *)local_1f8,auStack_1f0._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  auStack_1f0._16_8_ = auStack_1f0;
  local_1f8 = (undefined1  [8])0x0;
  auStack_1f0._0_8_ = (_Base_ptr)0x0;
  auStack_1f0._8_8_ = 0;
  local_1d0 = 0;
  local_130 = (_Base_ptr)
              local_170.super__Vector_base<Production_*,_std::allocator<Production_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_1d8 = (GLRState *)auStack_1f0._16_8_;
  if (local_170.super__Vector_base<Production_*,_std::allocator<Production_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_170.super__Vector_base<Production_*,_std::allocator<Production_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ppPVar17 = local_170.super__Vector_base<Production_*,_std::allocator<Production_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    do {
      pPVar16 = *ppPVar17;
      pvVar12 = Production::getToP_abi_cxx11_(pPVar16);
      uVar27 = 0xffffffffffffffff;
      lVar25 = 0;
      do {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_258,pvVar12);
        uVar7 = local_258._0_8_;
        getMarker_abi_cxx11_();
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_insert_rval((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_258,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (uVar7 + lVar25),(value_type *)local_228);
        if ((GLRParser *)local_228._0_8_ != (GLRParser *)local_218) {
          operator_delete((void *)local_228._0_8_,(ulong)(local_218._0_8_ + 1));
        }
        pGVar14 = (GLRParser *)operator_new(0x38);
        psVar13 = Production::getFromP_abi_cxx11_(pPVar16);
        Production::Production
                  ((Production *)pGVar14,psVar13,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_258);
        local_228._0_8_ = pGVar14;
        std::
        _Rb_tree<Production*,Production*,std::_Identity<Production*>,std::less<Production*>,std::allocator<Production*>>
        ::_M_insert_unique<Production*const&>
                  ((_Rb_tree<Production*,Production*,std::_Identity<Production*>,std::less<Production*>,std::allocator<Production*>>
                    *)local_1f8,(Production **)local_228);
        psVar13 = Production::getFromP_abi_cxx11_(pPVar16);
        sVar5 = psVar13->_M_string_length;
        if (sVar5 == local_2b0._M_string_length) {
          if (sVar5 == 0) {
            bVar28 = true;
          }
          else {
            iVar10 = bcmp((psVar13->_M_dataplus)._M_p,local_2b0._M_dataplus._M_p,sVar5);
            bVar28 = iVar10 == 0;
          }
          if ((uVar27 == 0xffffffffffffffff) && (bVar28)) {
            local_178 = (undefined1  [8])local_228._0_8_;
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_258);
        uVar27 = uVar27 + 1;
        lVar25 = lVar25 + 0x20;
      } while (uVar27 < (ulong)((long)(pvVar12->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_finish -
                                (long)(pvVar12->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start >> 5));
      ppPVar17 = ppPVar17 + 1;
    } while ((_Base_ptr)ppPVar17 != local_130);
  }
  local_258._0_8_ = local_178;
  __l_02._M_len = 1;
  __l_02._M_array = (iterator)local_258;
  std::set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>::set
            ((set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_> *)local_228,
             __l_02,(less<Production_*> *)local_290,(allocator_type *)local_1c0);
  do {
    bVar28 = closure(this,(set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>
                           *)local_228,
                     (set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_> *)
                     local_1f8);
  } while (bVar28);
  pGVar15 = (GLRState *)operator_new(0xb8);
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e0,local_2b0._M_dataplus._M_p,
             local_2b0._M_dataplus._M_p + local_2b0._M_string_length);
  std::
  _Rb_tree<Production_*,_Production_*,_std::_Identity<Production_*>,_std::less<Production_*>,_std::allocator<Production_*>_>
  ::_Rb_tree(&local_90,
             (_Rb_tree<Production_*,_Production_*,_std::_Identity<Production_*>,_std::less<Production_*>,_std::allocator<Production_*>_>
              *)local_228);
  GLRState::GLRState(pGVar15,&local_e0,
                     (set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_> *)
                     &local_90);
  std::
  _Rb_tree<Production_*,_Production_*,_std::_Identity<Production_*>,_std::less<Production_*>,_std::allocator<Production_*>_>
  ::~_Rb_tree(&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  local_108 = pGVar15;
  std::
  _Rb_tree<GLRState*,GLRState*,std::_Identity<GLRState*>,std::less<GLRState*>,std::allocator<GLRState*>>
  ::_M_insert_unique<GLRState*const&>(local_1a0,&local_108);
  this->startState = local_108;
  local_2e0 = 2;
LAB_0013085e:
  local_1c0._0_8_ = local_1c0 + 0x10;
  local_1c0._8_8_ = (_Base_ptr)0x0;
  local_1c0[0x10] = '\0';
  sVar26 = (this->states)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  iVar10 = 0;
  if (sVar26 != 0) {
    uVar27 = 0;
LAB_00130898:
    p_Var18 = (this->states)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    bVar28 = iVar10 == 0;
    if (iVar10 < 1) {
      while (!bVar28) {
        p_Var18 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var18);
        uVar27 = uVar27 + 1;
        bVar28 = uVar27 == 0;
      }
    }
    else {
      do {
        p_Var18 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var18);
        uVar27 = uVar27 - 1;
      } while (uVar27 != 0);
    }
    pGVar15 = *(GLRState **)(p_Var18 + 1);
    if ((pGVar15->productions)._M_t._M_impl.super__Rb_tree_header._M_node_count <=
        (pGVar15->prodEstablished)._M_t._M_impl.super__Rb_tree_header._M_node_count)
    goto LAB_0013099e;
    p_Var6 = (pGVar15->prodEstablished)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var20 = (pGVar15->productions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var2 = &(pGVar15->prodEstablished)._M_t._M_impl.super__Rb_tree_header;
    while( true ) {
      p_Var19 = p_Var6;
      if ((_Rb_tree_header *)p_Var6 != p_Var2) {
        lVar25 = *(long *)(p_Var20 + 1);
        while (*(long *)(p_Var19 + 1) != lVar25) {
          p_Var19 = (_Base_ptr)std::_Rb_tree_increment(p_Var19);
          if ((_Rb_tree_header *)p_Var19 == p_Var2) goto LAB_00130920;
        }
      }
      if ((_Rb_tree_header *)p_Var19 == p_Var2) break;
      p_Var20 = (_Base_ptr)std::_Rb_tree_increment(p_Var20);
    }
LAB_00130920:
    pGVar14 = *(GLRParser **)(p_Var20 + 1);
    local_258._0_8_ = pGVar14;
    pVar30 = std::
             _Rb_tree<Production*,Production*,std::_Identity<Production*>,std::less<Production*>,std::allocator<Production*>>
             ::_M_insert_unique<Production*const&>
                       ((_Rb_tree<Production*,Production*,std::_Identity<Production*>,std::less<Production*>,std::allocator<Production*>>
                         *)&pGVar15->prodEstablished,(Production **)local_258);
    symbolAfterMarker_abi_cxx11_((string *)local_258,pGVar14,pVar30._8_8_);
    std::__cxx11::string::operator=((string *)local_1c0,(string *)local_258);
    if ((GLRParser *)local_258._0_8_ != (GLRParser *)local_248) {
      operator_delete((void *)local_258._0_8_,(ulong)(local_248._0_8_ + 1));
    }
    if ((_Base_ptr)local_1c0._8_8_ == (_Base_ptr)0x0) {
      iVar10 = iVar10 + -1;
      sVar26 = (this->states)._M_t._M_impl.super__Rb_tree_header._M_node_count;
      goto LAB_0013099e;
    }
    local_258._8_4_ = _S_red;
    local_248._0_8_ = (pointer)0x0;
    local_248._8_8_ = local_258 + 8;
    local_230 = (_Base_ptr)0x0;
    p_Var6 = (pGVar15->productions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    auVar31._8_8_ = pGVar15;
    auVar31._0_8_ = p_Var6;
    p_Var2 = &(pGVar15->productions)._M_t._M_impl.super__Rb_tree_header;
    local_248._16_8_ = local_248._8_8_;
    if ((_Rb_tree_header *)p_Var6 == p_Var2) {
      local_290._8_4_ = _S_red;
      local_280._0_8_ = 0;
      local_280._8_8_ = local_290 + 8;
      local_280._24_8_ = 0;
      local_280._16_8_ = local_280._8_8_;
    }
    else {
      do {
        local_2d0._0_8_ = *(undefined8 *)(auVar31._0_8_ + 1);
        symbolAfterMarker_abi_cxx11_((string *)local_290,(GLRParser *)local_2d0._0_8_,auVar31._8_8_)
        ;
        uVar7 = local_290._0_8_;
        if ((_Base_ptr)local_1c0._8_8_ == (_Base_ptr)CONCAT44(local_290._12_4_,local_290._8_4_)) {
          if ((_Base_ptr)local_1c0._8_8_ == (_Base_ptr)0x0) {
            bVar28 = true;
          }
          else {
            iVar10 = bcmp((void *)local_1c0._0_8_,(void *)local_290._0_8_,local_1c0._8_8_);
            bVar28 = iVar10 == 0;
          }
        }
        else {
          bVar28 = false;
        }
        if ((Production *)uVar7 != (Production *)local_280) {
          operator_delete((void *)uVar7,local_280._0_8_ + 1);
        }
        if (bVar28) {
          std::
          _Rb_tree<Production*,Production*,std::_Identity<Production*>,std::less<Production*>,std::allocator<Production*>>
          ::_M_insert_unique<Production*const&>
                    ((_Rb_tree<Production*,Production*,std::_Identity<Production*>,std::less<Production*>,std::allocator<Production*>>
                      *)local_258,(Production **)local_2d0);
        }
        auVar31 = std::_Rb_tree_increment(auVar31._0_8_);
      } while ((_Rb_tree_header *)auVar31._0_8_ != p_Var2);
      local_290._8_4_ = _S_red;
      local_280._0_8_ = 0;
      local_280._8_8_ = local_290 + 8;
      local_280._24_8_ = 0;
      local_280._16_8_ = local_280._8_8_;
      p_Var18 = (_Rb_tree_node_base *)local_248._8_8_;
      p_Var23 = (_Rb_tree_node_base *)auStack_1f0._16_8_;
      while (auStack_1f0._16_8_ = p_Var23, p_Var18 != (_Rb_tree_node_base *)(local_258 + 8)) {
        if (p_Var23 != (_Rb_tree_node_base *)auStack_1f0) {
          pPVar16 = *(Production **)(p_Var18 + 1);
          do {
            local_2d0._0_8_ = *(undefined8 *)(p_Var23 + 1);
            bVar28 = isMarkerMovedRight(pPVar16,(Production *)local_2d0._0_8_);
            if (bVar28) {
              std::
              _Rb_tree<Production*,Production*,std::_Identity<Production*>,std::less<Production*>,std::allocator<Production*>>
              ::_M_insert_unique<Production*const&>
                        ((_Rb_tree<Production*,Production*,std::_Identity<Production*>,std::less<Production*>,std::allocator<Production*>>
                          *)local_290,(Production **)local_2d0);
            }
            p_Var23 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var23);
          } while (p_Var23 != (_Rb_tree_node_base *)auStack_1f0);
        }
        p_Var18 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var18);
        p_Var23 = (_Rb_tree_node_base *)auStack_1f0._16_8_;
      }
    }
    __val = -(uint)local_2e0;
    if (0 < (int)(uint)local_2e0) {
      __val = (uint)local_2e0;
    }
    __len = 1;
    if (9 < __val) {
      uVar27 = (ulong)__val;
      uVar9 = 4;
      do {
        __len = uVar9;
        uVar11 = (uint)uVar27;
        if (uVar11 < 100) {
          __len = __len - 2;
          goto LAB_00130bc6;
        }
        if (uVar11 < 1000) {
          __len = __len - 1;
          goto LAB_00130bc6;
        }
        if (uVar11 < 10000) goto LAB_00130bc6;
        uVar27 = uVar27 / 10000;
        uVar9 = __len + 4;
      } while (99999 < uVar11);
      __len = __len + 1;
    }
LAB_00130bc6:
    local_198[0] = (GLRState *)local_188;
    std::__cxx11::string::_M_construct
              ((ulong)local_198,(char)__len - ((char)(local_2e0 >> 0x18) >> 7));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((long)&(local_198[0]->name)._M_dataplus._M_p +
                       (ulong)((uint)local_2e0 >> 0x1f)),__len,__val);
    puVar21 = (undefined8 *)std::__cxx11::string::replace((ulong)local_198,0,(char *)0x0,0x143729);
    pGVar14 = (GLRParser *)(puVar21 + 2);
    if ((GLRParser *)*puVar21 == pGVar14) {
      local_2d0._16_8_ = *(undefined8 *)pGVar14;
      local_2d0._24_8_ = puVar21[3];
      local_2d0._0_8_ = (GLRParser *)(local_2d0 + 0x10);
    }
    else {
      local_2d0._16_8_ = *(undefined8 *)pGVar14;
      local_2d0._0_8_ = (GLRParser *)*puVar21;
    }
    local_2d0._8_8_ = puVar21[1];
    *puVar21 = pGVar14;
    puVar21[1] = 0;
    *(undefined1 *)(puVar21 + 2) = 0;
    if (local_198[0] != (GLRState *)local_188) {
      operator_delete(local_198[0],(ulong)(local_188._0_8_ + 1));
    }
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)local_280._32_8_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d0);
    do {
      bVar28 = closure(this,(set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>
                             *)local_290,
                       (set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_> *)
                       local_1f8);
    } while (bVar28);
    local_2e0 = (ulong)((uint)local_2e0 + 1);
    local_198[0] = (GLRState *)0x0;
    p_Var18 = (this->states)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((_Rb_tree_header *)p_Var18 == p_Var1) {
LAB_00130d63:
      pGVar22 = (GLRState *)operator_new(0xb8);
      local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_128,local_2d0._0_8_,(pointer)(local_2d0._0_8_ + local_2d0._8_8_));
      std::
      _Rb_tree<Production_*,_Production_*,_std::_Identity<Production_*>,_std::less<Production_*>,_std::allocator<Production_*>_>
      ::_Rb_tree(&local_c0,
                 (_Rb_tree<Production_*,_Production_*,_std::_Identity<Production_*>,_std::less<Production_*>,_std::allocator<Production_*>_>
                  *)local_290);
      GLRState::GLRState(pGVar22,&local_128,
                         (set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>
                          *)&local_c0);
      local_198[0] = pGVar22;
      std::
      _Rb_tree<Production_*,_Production_*,_std::_Identity<Production_*>,_std::less<Production_*>,_std::allocator<Production_*>_>
      ::~_Rb_tree(&local_c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p,
                        (ulong)(local_128.field_2._M_allocated_capacity + 1));
      }
      std::
      _Rb_tree<GLRState*,GLRState*,std::_Identity<GLRState*>,std::less<GLRState*>,std::allocator<GLRState*>>
      ::_M_insert_unique<GLRState*const&>(local_1a0,local_198);
    }
    else {
      bVar28 = false;
      do {
        while ((pGVar22 = *(GLRState **)(p_Var18 + 1),
               (pGVar22->productions)._M_t._M_impl.super__Rb_tree_header._M_node_count !=
               local_280._24_8_ ||
               (bVar29 = std::__equal<false>::
                         equal<std::_Rb_tree_const_iterator<Production*>,std::_Rb_tree_const_iterator<Production*>>
                                   ((pGVar22->productions)._M_t._M_impl.super__Rb_tree_header.
                                    _M_header._M_left,
                                    (_Rb_tree_const_iterator<Production_*>)
                                    &(pGVar22->productions)._M_t._M_impl.super__Rb_tree_header,
                                    (_Rb_tree_const_iterator<Production_*>)local_280._8_8_), !bVar29
               ))) {
          p_Var18 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var18);
          if ((_Rb_tree_header *)p_Var18 == p_Var1) {
            if (!bVar28) goto LAB_00130d63;
            goto LAB_00130dff;
          }
        }
        std::__cxx11::string::_M_assign((string *)local_2d0);
        local_198[0] = pGVar22;
        p_Var18 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var18);
        bVar28 = true;
      } while ((_Rb_tree_header *)p_Var18 != p_Var1);
    }
LAB_00130dff:
    GLRState::addStateTo(pGVar15,local_198[0],(string *)local_1c0);
    if ((GLRParser *)local_2d0._0_8_ != (GLRParser *)(local_2d0 + 0x10)) {
      operator_delete((void *)local_2d0._0_8_,local_2d0._16_8_ + 1);
    }
    std::
    _Rb_tree<Production_*,_Production_*,_std::_Identity<Production_*>,_std::less<Production_*>,_std::allocator<Production_*>_>
    ::~_Rb_tree((_Rb_tree<Production_*,_Production_*,_std::_Identity<Production_*>,_std::less<Production_*>,_std::allocator<Production_*>_>
                 *)local_290);
    std::
    _Rb_tree<Production_*,_Production_*,_std::_Identity<Production_*>,_std::less<Production_*>,_std::allocator<Production_*>_>
    ::~_Rb_tree((_Rb_tree<Production_*,_Production_*,_std::_Identity<Production_*>,_std::less<Production_*>,_std::allocator<Production_*>_>
                 *)local_258);
    iVar10 = 1;
  }
  goto LAB_00130e4a;
LAB_0013099e:
  iVar10 = iVar10 + 1;
  uVar27 = (ulong)iVar10;
  if (sVar26 <= uVar27) goto code_r0x001309ad;
  goto LAB_00130898;
code_r0x001309ad:
  iVar10 = 0;
LAB_00130e4a:
  if ((_Base_ptr)local_1c0._0_8_ != (_Base_ptr)(local_1c0 + 0x10)) {
    operator_delete((void *)local_1c0._0_8_,CONCAT71(local_1c0._17_7_,local_1c0[0x10]) + 1);
  }
  if ((char)iVar10 == '\0') {
    p_Var18 = (this->states)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((_Rb_tree_header *)p_Var18 != p_Var1) {
      do {
        lVar25 = *(long *)(p_Var18 + 1);
        p_Var23 = *(_Rb_tree_node_base **)(lVar25 + 0x70);
        if (p_Var23 != (_Rb_tree_node_base *)(lVar25 + 0x60)) {
          bVar28 = false;
          do {
            pvVar12 = Production::getToP_abi_cxx11_(*(Production **)(p_Var23 + 1));
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_290,pvVar12);
            uVar7 = local_290._0_8_;
            pPVar16 = (Production *)CONCAT44(local_290._12_4_,local_290._8_4_);
            if ((Production *)local_290._0_8_ != pPVar16) {
              getMarker_abi_cxx11_();
              uVar8 = local_258._0_8_;
              sVar5 = *(size_t *)(uVar7 + (long)pPVar16 + (-0x18 - uVar7));
              if (sVar5 == CONCAT44(local_258._12_4_,local_258._8_4_)) {
                if (sVar5 == 0) {
                  bVar29 = true;
                }
                else {
                  iVar10 = bcmp(*(void **)(uVar7 + (long)pPVar16 + (-0x20 - uVar7)),
                                (void *)local_258._0_8_,sVar5);
                  bVar29 = iVar10 == 0;
                }
              }
              else {
                bVar29 = false;
              }
              if ((GLRParser *)uVar8 != (GLRParser *)local_248) {
                operator_delete((void *)uVar8,(ulong)(local_248._0_8_ + 1));
              }
              bVar28 = (bool)(bVar28 | bVar29);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_290);
            p_Var23 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var23);
          } while (p_Var23 != (_Rb_tree_node_base *)(lVar25 + 0x60));
          if (bVar28) {
            *(undefined1 *)(lVar25 + 0x20) = 1;
          }
        }
        p_Var18 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var18);
      } while ((_Rb_tree_header *)p_Var18 != p_Var1);
    }
    std::
    _Rb_tree<Production_*,_Production_*,_std::_Identity<Production_*>,_std::less<Production_*>,_std::allocator<Production_*>_>
    ::~_Rb_tree((_Rb_tree<Production_*,_Production_*,_std::_Identity<Production_*>,_std::less<Production_*>,_std::allocator<Production_*>_>
                 *)local_228);
    std::
    _Rb_tree<Production_*,_Production_*,_std::_Identity<Production_*>,_std::less<Production_*>,_std::allocator<Production_*>_>
    ::~_Rb_tree((_Rb_tree<Production_*,_Production_*,_std::_Identity<Production_*>,_std::less<Production_*>,_std::allocator<Production_*>_>
                 *)local_1f8);
    if (local_150 != (_Base_ptr)local_140) {
      operator_delete(local_150,(ulong)((long)&local_140[0]->_M_color + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
    if (local_170.super__Vector_base<Production_*,_std::allocator<Production_*>_>._M_impl.
        super__Vector_impl_data._M_start != (Production **)0x0) {
      operator_delete(local_170.super__Vector_base<Production_*,_std::allocator<Production_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_170.
                            super__Vector_base<Production_*,_std::allocator<Production_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_170.
                            super__Vector_base<Production_*,_std::allocator<Production_*>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    return;
  }
  goto LAB_0013085e;
}

Assistant:

GLRParser::GLRParser(CFG *cfg, bool verbose) : verbose(verbose) {

    cfg->splitUpLongerTerminals();

    // Convert vector to set
    for (const auto &c: cfg->getNonTerminalsV()) {
        nonTerminalsV.insert(c);
    }
    for (const auto &c: cfg->getTerminalsT()) {
        terminalsT.insert(c);
    }

    // TODO: fix all terminals only 1 char
    std::vector<Production *> productionsP = cfg->getProductionsP();
    std::string startS = cfg->getStartS();

    int stateNr = 1;

    // Start by creating a new start state
    std::string oldStartState = startS;
    startS = startStateName();
    stateNr++;
    nonTerminalsV.insert(startS);
    // and letting this start state point to the original one
    auto *start = new Production(startS, {oldStartState});
    // (This ensures the start state appears in only one rewrite rule)
    productionsP.push_back(start);

    acceptState = new GLRState("accept", {new Production("accept", {startS})});

    // Introduce the marker ^ in all productions
    std::set<Production *> markedProductions = {};
    for (auto production: productionsP) {
        const std::vector<std::string> &prodTo = production->getToP();
        for (int i = 0; i <= prodTo.size(); ++i) { // TODO: Check whether <= doesn't give an overflow error
            std::vector<std::string> prodToMarked = prodTo;
            prodToMarked.insert(prodToMarked.begin() + i, getMarker());
            auto *markedProduction = new Production(production->getFromP(), prodToMarked);
            markedProductions.insert(markedProduction);
            if (production->getFromP() == startS && i == 0) {
                start = markedProduction;
            }
        }
    }


    // 1. Form the closure of the set containing the single marked rule S' -> ^S. Establish this set as the initial ste
    //     in the transition diastagram.
    // Start state is the new start
    std::set<Production *> startClosure = {start};
    while (closure(startClosure, markedProductions)) {}
    auto *newState = new GLRState(startS, startClosure);
    states.insert(newState);
    startState = newState;
//    std::set<Production *> establishedRulesInState = startClosure;
    // States is the vector containing all established states
//    std::set<Production *> processedProductions = {};


    // 2. While possible without redundancy do the following:
    while ("Possible without redundancy") { // Redundant once all productions are processed
        // a. Select a symbol s (terminal or nonterminal) appearing emmediately to the right of the marker in a rule in
        //     some established state A.
        std::string s;
        GLRState *stateA{};
        for (int i = 0; i < states.size(); ++i) {
            // Get the i-th element
            auto glrStateItr = states.begin();
            std::advance(glrStateItr, i);
            GLRState *glrState = *glrStateItr;

            if (glrState->getProductions().size() <= glrState->getProdEstablished().size()) {
                continue;
            }

//            std::cout << glrState->getName() << " has " << glrState->getProdEstablished().size() << " of " << glrState->getProductions().size()  << " productions established."<< std::endl;

            auto productionItr = glrState->getProductions().begin();
            Production *production;
            while (true) {
                // Check whether the current production is already established
                if (std::find(glrState->getProdEstablished().begin(), glrState->getProdEstablished().end(),
                              *productionItr) == glrState->getProdEstablished().end()) {
                    production = *productionItr;
                    glrState->increaseEstablished(production);
                    break;
                } else {
                    // TODO: fix stuck in Moved loop
//                    std::cerr << "Moved" << std::endl;
                    productionItr++;
                }
            }


            s = symbolAfterMarker(production);
            // Marker at end
            if (s.empty()) {
                i--;
                continue;
            }
            stateA = glrState;
            break;

        }
        if (s.empty()) {
//            std::cout << "No more found." << std::endl;
            break;
        }

        // b. Let X denote the collection of all marked rules in A that have s immediately to the right of their markers.
        std::set<Production *> sImmRightX;
        for (Production *production: stateA->getProductions()) {
            if (s == symbolAfterMarker(production)) {
                sImmRightX.insert(production);
            }
        }

        // c. Let Y be the set of marked rules obtained by moving the marker in each rule in X to the right of the symbol s.
        std::set<Production *> sMovedRightOfX;
        for (Production *production: sImmRightX) {
            for (Production *prod: markedProductions) {
                if (isMarkerMovedRight(production, prod)) {
                    sMovedRightOfX.insert(prod);
                }
            }
        }

        // d. If the closure of Y has not yet been established as a state, do so now.

        // Find a new name for the variable
//        char newVariable = 'A';
//        while (inVector(toString(newVariable), nonTerminalsV)) { newVariable++; }
        std::string var = "STATE#" + std::to_string(stateNr++);
        nonTerminalsV.insert(var);

        // Calculate the closure
        while (closure(sMovedRightOfX, markedProductions)) {}

        // Find another state with this closure
        GLRState *closureY{};
        bool stateExists = false;
        for (GLRState *s2: states) {
            if (s2->getProductions() == sMovedRightOfX) {
                var = s2->getName();
                stateExists = true;
                closureY = s2;
            }
        }

        if (!stateExists) {
            closureY = new GLRState(var, sMovedRightOfX);
            states.insert(closureY);
        }

        // e. Draw an arc labeled s from state A to closure of Y
        stateA->addStateTo(closureY, s);
//        std::string filename = "output/yeet" + var + ".dot";
//        toDot(filename);
    }

    // 3. Let each state represented by marked rules in terminal form be accept states in the automaton.
    for (auto state: states) {
        bool containsTerminalProduction = false; // TODO: check containsProduction or allProductions
        for (auto rule: state->getProductions()) {
            auto prodTo = rule->getToP();
            if (!prodTo.empty() && prodTo[prodTo.size() - 1] == getMarker()) {
                containsTerminalProduction = true;
            }
        }
        if (containsTerminalProduction) {
            state->setAccepting(true);
        }
    }

//    toDot("output/GLRParserTransitionScheme.dot");
//    buildTable();
//    printTable();
}